

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# scene.cpp
# Opt level: O2

Collision * __thiscall
Scene::findNearestCollision
          (Collision *__return_storage_ptr__,Scene *this,Vector3 *start,Vector3 *dir)

{
  pointer ppLVar1;
  pointer ppOVar2;
  long lVar3;
  pointer ppOVar4;
  Collision *pCVar5;
  Collision *pCVar6;
  pointer ppLVar7;
  byte bVar8;
  Collision coll;
  
  bVar8 = 0;
  Collision::Collision(__return_storage_ptr__);
  ppLVar1 = (this->m_lights).super__Vector_base<Light_*,_std::allocator<Light_*>_>._M_impl.
            super__Vector_impl_data._M_finish;
  for (ppLVar7 = (this->m_lights).super__Vector_base<Light_*,_std::allocator<Light_*>_>._M_impl.
                 super__Vector_impl_data._M_start; ppLVar7 != ppLVar1; ppLVar7 = ppLVar7 + 1) {
    (*(*ppLVar7)->_vptr_Light[3])(&coll,*ppLVar7,start,dir);
    if ((coll.dist < 1000000000.0) && (coll.dist + 1e-06 < __return_storage_ptr__->dist)) {
      pCVar5 = &coll;
      pCVar6 = __return_storage_ptr__;
      for (lVar3 = 0x10; lVar3 != 0; lVar3 = lVar3 + -1) {
        pCVar6->object = pCVar5->object;
        pCVar5 = (Collision *)((long)pCVar5 + (ulong)bVar8 * -0x10 + 8);
        pCVar6 = (Collision *)((long)pCVar6 + (ulong)bVar8 * -0x10 + 8);
      }
    }
  }
  ppOVar2 = (this->m_objects).super__Vector_base<Object_*,_std::allocator<Object_*>_>._M_impl.
            super__Vector_impl_data._M_finish;
  for (ppOVar4 = (this->m_objects).super__Vector_base<Object_*,_std::allocator<Object_*>_>._M_impl.
                 super__Vector_impl_data._M_start; ppOVar4 != ppOVar2; ppOVar4 = ppOVar4 + 1) {
    (*(*ppOVar4)->_vptr_Object[2])(&coll,*ppOVar4,start,dir);
    if ((coll.dist < 1000000000.0) && (coll.dist + 1e-06 < __return_storage_ptr__->dist)) {
      pCVar5 = &coll;
      pCVar6 = __return_storage_ptr__;
      for (lVar3 = 0x10; lVar3 != 0; lVar3 = lVar3 + -1) {
        pCVar6->object = pCVar5->object;
        pCVar5 = (Collision *)((long)pCVar5 + (ulong)bVar8 * -0x10 + 8);
        pCVar6 = (Collision *)((long)pCVar6 + (ulong)bVar8 * -0x10 + 8);
      }
    }
  }
  return __return_storage_ptr__;
}

Assistant:

Collision Scene::findNearestCollision(const Vector3& start, const Vector3& dir) const
{
    Collision ret;
    for (auto l : m_lights)
    {
        Collision coll = l->collide(start, dir);
        if (coll.isHit() && coll.dist + Const::EPS < ret.dist) ret = coll;
    }
    for (auto o : m_objects)
    {
        Collision coll = o->collide(start, dir);
        if (coll.isHit() && coll.dist + Const::EPS < ret.dist) ret = coll;
    }
    return ret;
}